

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  long *plVar1;
  byte in_DL;
  long *in_RSI;
  float _x;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  vec3 vVar5;
  vec3 center;
  vec3 normal;
  SlicePlane *in_stack_fffffffffffffee0;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  SlicePlane *in_stack_ffffffffffffff20;
  string local_a0 [32];
  undefined8 local_80;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_78;
  undefined8 local_6c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_64;
  undefined8 local_60;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_58;
  undefined8 local_50;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_48;
  undefined8 local_44;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3c;
  undefined8 local_38;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_30;
  undefined8 local_2c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_24;
  undefined8 local_20;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_18;
  byte local_11;
  long *local_10;
  
  auVar4 = in_ZMM0._8_56_;
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (local_11 == 0) {
    vVar5 = getNormal(in_stack_ffffffffffffff20);
    local_58 = vVar5.field_2;
    auVar2._0_8_ = vVar5._0_8_;
    auVar2._8_56_ = auVar4;
    local_60 = vmovlpd_avx(auVar2._0_16_);
    local_50 = local_60;
    local_48 = local_58;
    local_20 = local_60;
    local_18 = local_58;
    vVar5 = getCenter(in_stack_fffffffffffffee0);
    local_78 = vVar5.field_2;
    auVar3._0_8_ = vVar5._0_8_;
    auVar3._8_56_ = auVar4;
    local_80 = vmovlpd_avx(auVar3._0_16_);
    local_6c = local_80;
    local_64 = local_78;
    local_2c = local_80;
    local_24 = local_78;
  }
  else {
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_38,-1.0,0.0,0.0);
    local_20 = local_38;
    local_18 = local_30;
    _x = std::numeric_limits<float>::infinity();
    glm::vec<3,float,(glm::qualifier)0>::vec<float,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_44,_x,0.0,0.0);
    local_2c = local_44;
    local_24 = local_3c;
  }
  plVar1 = local_10;
  psVar6 = local_a0;
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  (**(code **)(*plVar1 + 0x48))(local_20,local_18.z,plVar1,psVar6);
  std::__cxx11::string::~string(local_a0);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  (**(code **)(*local_10 + 0x48))(local_2c,local_24.z,local_10,&stack0xffffffffffffff10);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    normal = getNormal();
    center = getCenter();
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}